

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

void secp256k1_context_preallocated_destroy(secp256k1_context *ctx)

{
  if (secp256k1_context_no_precomp == ctx) {
    secp256k1_context_preallocated_destroy_cold_1();
  }
  else if (ctx == (secp256k1_context *)0x0) {
    return;
  }
  memset(ctx,0,0xac);
  return;
}

Assistant:

void secp256k1_context_preallocated_destroy(secp256k1_context* ctx) {
    ARG_CHECK_NO_RETURN(ctx != secp256k1_context_no_precomp);
    if (ctx != NULL) {
        secp256k1_ecmult_context_clear(&ctx->ecmult_ctx);
        secp256k1_ecmult_gen_context_clear(&ctx->ecmult_gen_ctx);
    }
}